

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainTest.h
# Opt level: O0

void __thiscall
oout::ContainTest::ContainTest<char_const*>(ContainTest *this,string *text,char *subs)

{
  char *__s;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [16];
  shared_ptr<const_oout::Text> local_30;
  char *local_20;
  char *subs_local;
  string *text_local;
  ContainTest *this_local;
  
  local_20 = subs;
  subs_local = (char *)text;
  text_local = (string *)this;
  std::make_shared<oout::StringText,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::shared_ptr<oout::Text_const>::shared_ptr<oout::StringText,void>
            ((shared_ptr<oout::Text_const> *)&local_30,(shared_ptr<oout::StringText> *)local_40);
  __s = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,__s,&local_61);
  ContainTest<>(this,&local_30,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  std::shared_ptr<const_oout::Text>::~shared_ptr(&local_30);
  std::shared_ptr<oout::StringText>::~shared_ptr((shared_ptr<oout::StringText> *)local_40);
  return;
}

Assistant:

ContainTest(
		const std::string &text,
		S ... subs
	) : ContainTest(std::make_shared<StringText>(text), subs...)
	{
	}